

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_repair_after_lazy(roaring_bitmap_t *r)

{
  container_t *pcVar1;
  container_t *new_c;
  container_t *pcStack_28;
  uint8_t new_type;
  container_t *old_c;
  uint8_t old_type;
  roaring_bitmap_t *prStack_18;
  int i;
  roaring_array_t *ra;
  roaring_bitmap_t *r_local;
  
  old_c._4_4_ = 0;
  prStack_18 = r;
  ra = &r->high_low_container;
  for (; old_c._4_4_ < (prStack_18->high_low_container).size; old_c._4_4_ = old_c._4_4_ + 1) {
    new_c._7_1_ = (prStack_18->high_low_container).typecodes[old_c._4_4_];
    pcStack_28 = (prStack_18->high_low_container).containers[old_c._4_4_];
    old_c._3_1_ = new_c._7_1_;
    pcVar1 = container_repair_after_lazy(pcStack_28,(uint8_t *)((long)&new_c + 7));
    (prStack_18->high_low_container).containers[old_c._4_4_] = pcVar1;
    (prStack_18->high_low_container).typecodes[old_c._4_4_] = new_c._7_1_;
  }
  return;
}

Assistant:

void roaring_bitmap_repair_after_lazy(roaring_bitmap_t *r) {
    roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i) {
        const uint8_t old_type = ra->typecodes[i];
        container_t *old_c = ra->containers[i];
        uint8_t new_type = old_type;
        container_t *new_c = container_repair_after_lazy(old_c, &new_type);
        ra->containers[i] = new_c;
        ra->typecodes[i] = new_type;
    }
}